

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void value_count_suite::count_array(void)

{
  size_type in_RCX;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_860;
  basic_variable<std::allocator<char>_> *local_7a8;
  undefined4 local_79c;
  basic_variable<std::allocator<char>_> local_798;
  size_type local_768;
  undefined4 local_75c;
  size_type local_758 [2];
  undefined4 local_748;
  nullable local_744;
  basic_variable<std::allocator<char>_> *local_740;
  basic_variable<std::allocator<char>_> local_738;
  undefined1 local_708 [64];
  size_type local_6c8;
  undefined4 local_6bc;
  basic_variable<std::allocator<char>_> local_6b8;
  size_type local_688;
  undefined4 local_67c;
  basic_variable<std::allocator<char>_> local_678;
  size_type local_648;
  undefined4 local_63c;
  size_type local_638;
  undefined4 local_62c;
  basic_variable<std::allocator<char>_> local_628;
  size_type local_5f8;
  undefined4 local_5ec;
  size_type local_5e8;
  undefined4 local_5dc;
  basic_variable<std::allocator<char>_> local_5d8;
  size_type local_5a0;
  undefined4 local_594;
  double local_590;
  size_type local_588;
  undefined4 local_57c;
  basic_variable<std::allocator<char>_> local_578;
  size_type local_540;
  undefined4 local_534;
  double local_530;
  size_type local_528;
  undefined4 local_51c;
  basic_variable<std::allocator<char>_> local_518;
  size_type local_4e0 [2];
  undefined4 local_4d0;
  int local_4cc;
  size_type local_4c8;
  undefined4 local_4bc;
  basic_variable<std::allocator<char>_> local_4b8;
  size_type local_480 [2];
  undefined4 local_470;
  int local_46c;
  size_type local_468;
  undefined4 local_45c;
  basic_variable<std::allocator<char>_> local_458;
  size_type local_420 [2];
  undefined4 local_410;
  bool local_409;
  size_type local_408;
  undefined4 local_3fc;
  basic_variable<std::allocator<char>_> local_3f8;
  size_type local_3c0 [2];
  undefined4 local_3b0;
  bool local_3a9;
  size_type local_3a8;
  undefined4 local_39c;
  basic_variable<std::allocator<char>_> local_398;
  size_type local_368 [2];
  undefined4 local_358;
  nullable local_354;
  size_type local_350;
  nullable local_344 [8];
  nullable local_324;
  basic_variable<std::allocator<char>_> *local_320;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_320 = &local_318;
  local_324 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,&local_324);
  local_320 = &local_2e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_320,true);
  local_320 = &local_2b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_320,2);
  local_320 = &local_288;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_320,3.0);
  local_320 = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,"hydrogen");
  local_320 = &local_228;
  local_344[3] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,local_344 + 3);
  local_320 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_320,true);
  local_320 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_320,2);
  local_320 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_320,3.0);
  local_320 = &local_168;
  local_344[2] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,local_344 + 2);
  local_320 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_320,true);
  local_320 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_320,2);
  local_320 = &local_d8;
  local_344[1] = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,local_344 + 1);
  local_320 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_320,true);
  local_320 = &local_78;
  local_344[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_320,local_344);
  local_48._0_8_ = &local_318;
  local_48._8_8_ = 0xf;
  init._M_len = in_RCX;
  init._M_array = (iterator)0xf;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_7a8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_7a8 = local_7a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_7a8);
  } while (local_7a8 != &local_318);
  local_354 = null;
  local_350 = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_354);
  local_358 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x121,"void value_count_suite::count_array()",&local_350,&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398);
  local_368[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_398);
  local_39c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x122,"void value_count_suite::count_array()",local_368,&local_39c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  local_3a9 = true;
  local_3a8 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_3a9);
  local_3b0 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x123,"void value_count_suite::count_array()",&local_3a8,&local_3b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_3f8,true);
  local_3c0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_3f8);
  local_3fc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x124,"void value_count_suite::count_array()",local_3c0,&local_3fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  local_409 = false;
  local_408 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_409);
  local_410 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x125,"void value_count_suite::count_array()",&local_408,&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_458,false);
  local_420[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_458);
  local_45c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(false))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x126,"void value_count_suite::count_array()",local_420,&local_45c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  local_46c = 2;
  local_468 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_46c);
  local_470 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x127,"void value_count_suite::count_array()",&local_468,&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_4b8,2);
  local_480[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_4b8);
  local_4bc = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x128,"void value_count_suite::count_array()",local_480,&local_4bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  local_4cc = 0x16;
  local_4c8 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_4cc);
  local_4d0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 22)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x129,"void value_count_suite::count_array()",&local_4c8,&local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_518,0x16);
  local_4e0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_518);
  local_51c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(22))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x12a,"void value_count_suite::count_array()",local_4e0,&local_51c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  local_530 = 3.0;
  local_528 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_530);
  local_534 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,299,"void value_count_suite::count_array()",&local_528,&local_534);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_578,3.0);
  local_540 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_578);
  local_57c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,300,"void value_count_suite::count_array()",&local_540,&local_57c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_578);
  local_590 = 33.0;
  local_588 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_590);
  local_594 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 33.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x12d,"void value_count_suite::count_array()",&local_588,&local_594);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5d8,33.0);
  local_5a0 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_5d8);
  local_5dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(33.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x12e,"void value_count_suite::count_array()",&local_5a0,&local_5dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  local_5e8 = trial::dynamic::value::count<std::allocator<char>,char[9]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [9])"hydrogen");
  local_5ec = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"hydrogen\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x12f,"void value_count_suite::count_array()",&local_5e8,&local_5ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_628,"hydrogen");
  local_5f8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_628);
  local_62c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"hydrogen\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x130,"void value_count_suite::count_array()",&local_5f8,&local_62c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  local_638 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (char (*) [6])"alpha");
  local_63c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x131,"void value_count_suite::count_array()",&local_638,&local_63c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_678,"alpha");
  local_648 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_678);
  local_67c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x132,"void value_count_suite::count_array()",&local_648,&local_67c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_678);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_688 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_6b8);
  local_6bc = 0;
  sVar1 = 0x133;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x133,"void value_count_suite::count_array()",&local_688,&local_6bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6b8);
  local_740 = &local_738;
  local_744 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_740,&local_744);
  local_708._0_8_ = &local_738;
  local_708._8_8_ = 1;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_708 + 0x10),
             (basic_array<std::allocator<char>_> *)local_708._0_8_,init_00);
  local_6c8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                         (basic_variable<std::allocator<char>_> *)(local_708 + 0x10));
  local_748 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make({ null }))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x134,"void value_count_suite::count_array()",&local_6c8,&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_708 + 0x10));
  local_860 = (basic_variable<std::allocator<char>_> *)local_708;
  do {
    local_860 = local_860 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_860);
  } while (local_860 != &local_738);
  local_758[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_75c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, data)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x135,"void value_count_suite::count_array()",local_758,&local_75c);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_768 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),&local_798);
  local_79c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x136,"void value_count_suite::count_array()",&local_768,&local_79c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_array()
{
    variable data = array::make(
        { null, true, 2, 3.0, "hydrogen",
          null, true, 2, 3.0,
          null, true, 2,
          null, true,
          null });

    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, false), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(false)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 22), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(22)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 33.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(33.0)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "hydrogen"), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("hydrogen")), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make({ null })), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, data), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
}